

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O2

int Aig_ManPackAddPatternTry(Aig_ManPack_t *p,int iBit,Vec_Int_t *vLits)

{
  uint *puVar1;
  uint uVar2;
  Vec_Wrd_t *pVVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  word *pwVar8;
  word *pwVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  
  lVar11 = (long)(iBit >> 5);
  uVar10 = iBit & 0x1f;
  uVar4 = 1 << (sbyte)uVar10;
  iVar12 = 0;
  while( true ) {
    iVar5 = vLits->nSize;
    if (iVar5 <= iVar12) {
      for (iVar12 = 0; iVar12 < iVar5; iVar12 = iVar12 + 1) {
        iVar5 = Vec_IntEntry(vLits,iVar12);
        pVVar3 = p->vPiPats;
        iVar6 = Abc_Lit2Var(iVar5);
        pwVar8 = Vec_WrdEntryP(pVVar3,iVar6);
        pVVar3 = p->vPiCare;
        iVar6 = Abc_Lit2Var(iVar5);
        pwVar9 = Vec_WrdEntryP(pVVar3,iVar6);
        puVar1 = (uint *)((long)pwVar9 + lVar11 * 4);
        *puVar1 = *puVar1 | uVar4;
        uVar2 = *(uint *)((long)pwVar8 + lVar11 * 4);
        uVar7 = Abc_LitIsCompl(iVar5);
        if (((uVar2 >> uVar10 & 1) != 0) == uVar7) {
          puVar1 = (uint *)((long)pwVar8 + lVar11 * 4);
          *puVar1 = *puVar1 ^ uVar4;
        }
        iVar5 = vLits->nSize;
      }
      return 1;
    }
    iVar5 = Vec_IntEntry(vLits,iVar12);
    pVVar3 = p->vPiPats;
    iVar6 = Abc_Lit2Var(iVar5);
    pwVar8 = Vec_WrdEntryP(pVVar3,iVar6);
    pVVar3 = p->vPiCare;
    iVar6 = Abc_Lit2Var(iVar5);
    pwVar9 = Vec_WrdEntryP(pVVar3,iVar6);
    if (((*(uint *)((long)pwVar9 + lVar11 * 4) & uVar4) != 0) &&
       (uVar2 = *(uint *)((long)pwVar8 + lVar11 * 4), uVar7 = Abc_LitIsCompl(iVar5),
       ((uVar2 >> uVar10 & 1) != 0) == uVar7)) break;
    iVar12 = iVar12 + 1;
  }
  return 0;
}

Assistant:

int Aig_ManPackAddPatternTry( Aig_ManPack_t * p, int iBit, Vec_Int_t * vLits )
{
    word * pInfo, * pPres;
    int i, Lit;
    Vec_IntForEachEntry( vLits, Lit, i )
    {
        pInfo = Vec_WrdEntryP( p->vPiPats, Abc_Lit2Var(Lit) );
        pPres = Vec_WrdEntryP( p->vPiCare, Abc_Lit2Var(Lit) );
        if ( Abc_InfoHasBit( (unsigned *)pPres, iBit ) && 
             Abc_InfoHasBit( (unsigned *)pInfo, iBit ) == Abc_LitIsCompl(Lit) )
             return 0;
    }
    Vec_IntForEachEntry( vLits, Lit, i )
    {
        pInfo = Vec_WrdEntryP( p->vPiPats, Abc_Lit2Var(Lit) );
        pPres = Vec_WrdEntryP( p->vPiCare, Abc_Lit2Var(Lit) );
        Abc_InfoSetBit( (unsigned *)pPres, iBit );
        if ( Abc_InfoHasBit( (unsigned *)pInfo, iBit ) == Abc_LitIsCompl(Lit) )
             Abc_InfoXorBit( (unsigned *)pInfo, iBit );
    }
    return 1;
}